

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

void __thiscall
TidyConfigParser::setCheckConfig
          (TidyConfigParser *this,string *configName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configValues)

{
  string *psVar1;
  int iVar2;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  invalid_argument *this_00;
  undefined8 extraout_RAX_02;
  long *plVar3;
  char *__s;
  int extraout_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  pointer __str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (configName,"clkName");
  if (iVar2 == 0) {
    __str = (configValues->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(configValues->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)__str;
    if (lVar5 == 0x20) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->config;
LAB_001a54f2:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (pbVar4,__str);
      return;
    }
    local_68.field_2._M_allocated_capacity = lVar5 >> 5;
    local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
    local_68._M_string_length = configName->_M_string_length;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt.size_ = 0x4d;
    fmt.data_ = (char *)0x34;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_88,(v11 *)"Expected one configuration value for \'{}\' but got {}",fmt,args);
    reportErrorAndExit(this,&local_88);
    lVar5 = extraout_RAX;
LAB_001a559c:
    local_68.field_2._M_allocated_capacity = lVar5 >> 5;
    local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
    local_68._M_string_length = configName->_M_string_length;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt_00.size_ = 0x4d;
    fmt_00.data_ = (char *)0x34;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_88,(v11 *)"Expected one configuration value for \'{}\' but got {}",fmt_00,
               args_00);
    reportErrorAndExit(this,&local_88);
    lVar5 = extraout_RAX_00;
LAB_001a55d9:
    local_68.field_2._M_allocated_capacity = lVar5 >> 5;
    local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
    local_68._M_string_length = configName->_M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_68;
    fmt_01.size_ = 0x4d;
    fmt_01.data_ = (char *)0x34;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_88,(v11 *)"Expected one configuration value for \'{}\' but got {}",fmt_01,
               args_01);
    reportErrorAndExit(this,&local_88);
    lVar5 = extraout_RAX_01;
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (configName,"resetName");
    if (iVar2 == 0) {
      __str = (configValues->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(configValues->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__str;
      if (lVar5 == 0x20) {
        pbVar4 = &(this->config).checkConfigs.resetName;
        goto LAB_001a54f2;
      }
      goto LAB_001a559c;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (configName,"clkNameRegexString");
    if (iVar2 == 0) {
      pbVar4 = (configValues->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(configValues->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
      if (lVar5 == 0x20) {
        psVar1 = &(this->config).checkConfigs.clkNameRegexString;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (psVar1,pbVar4);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_68,psVar1,0x10);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  (&(this->config).checkConfigs.clkNameRegexPattern,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68);
        return;
      }
      goto LAB_001a55d9;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (configName,"resetIsActiveHigh");
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(configName,"inputPortSuffix");
      if (iVar2 == 0) {
        lVar5 = 0x280;
LAB_001a549f:
        parseConfigValue<std::__cxx11::string>
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&(this->keywords)._M_h._M_buckets + lVar5),configValues);
        return;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(configName,"outputPortSuffix");
      if (iVar2 == 0) {
        lVar5 = 0x298;
        goto LAB_001a549f;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(configName,"inoutPortSuffix");
      lVar5 = 0x2b0;
      if (iVar2 == 0) goto LAB_001a549f;
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(configName,"moduleInstantiationPrefix");
      if (iVar2 == 0) {
        __str = (configValues->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(configValues->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)__str;
        if (lVar5 != 0x20) {
          local_68.field_2._M_allocated_capacity = lVar5 >> 5;
          local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
          local_68._M_string_length = configName->_M_string_length;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_68;
          fmt_04.size_ = 0x4d;
          fmt_04.data_ = (char *)0x34;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_88,(v11 *)"Expected one configuration value for \'{}\' but got {}",
                     fmt_04,args_04);
          reportErrorAndExit(this,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if (extraout_EDX == 1) {
            plVar3 = (long *)__cxa_begin_catch(extraout_RAX_02);
            __s = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_89);
            reportWarning(this,&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            }
            __cxa_end_catch();
            return;
          }
          _Unwind_Resume(extraout_RAX_02);
        }
        pbVar4 = &(this->config).checkConfigs.moduleInstantiationPrefix;
        goto LAB_001a54f2;
      }
      goto LAB_001a5653;
    }
    psVar1 = (configValues->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(configValues->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
    if (lVar5 == 0x20) {
      parseConfigValue(this,&(this->config).checkConfigs.resetIsActiveHigh,psVar1);
      return;
    }
  }
  local_68.field_2._M_allocated_capacity = lVar5 >> 5;
  local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
  local_68._M_string_length = configName->_M_string_length;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)&local_68;
  fmt_02.size_ = 0x4d;
  fmt_02.data_ = (char *)0x34;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_88,(v11 *)"Expected one configuration value for \'{}\' but got {}",fmt_02,
             args_02);
  reportErrorAndExit(this,&local_88);
LAB_001a5653:
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
  local_88._M_string_length = configName->_M_string_length;
  args_03.field_1.values_ = in_R9.values_;
  args_03.desc_ = (unsigned_long_long)&local_88;
  fmt_03.size_ = 0xd;
  fmt_03.data_ = (char *)0x1c;
  ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"The check: {} does not exist",fmt_03,args_03);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void TidyConfigParser::setCheckConfig(const std::string& configName,
                                      std::vector<std::string> configValues) {
    SLANG_TRY {
        config.visitConfig(configName, [&](auto& v) {
            if constexpr (is_vector_v<std::remove_cvref_t<decltype(v)>>) {
                parseConfigValue(v, std::move(configValues));
            }
            else {
                if (configValues.size() != 1) {
                    reportErrorAndExit(
                        fmt::format("Expected one configuration value for '{}' but got {}",
                                    configName, configValues.size()));
                }
                parseConfigValue(v, std::move(configValues.front()));
            }
        });
    }